

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void delete_list(void)

{
  node *pnVar1;
  node *local_18;
  node *node;
  node *temp;
  
  local_18 = first;
  while (local_18 != (node *)0x0) {
    pnVar1 = local_18->next;
    free(local_18);
    local_18 = pnVar1;
  }
  first = (node *)0x0;
  return;
}

Assistant:

void delete_list() {
    struct node *temp;
    struct node *node = first;
    while (node != NULL) {
        temp = node;
        node = node->next;
        free(temp);
    }
    first = NULL;
}